

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O1

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleTextureNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  int iVar1;
  Property *pPVar2;
  Value *this_00;
  char *__s;
  size_t sVar3;
  uint type;
  aiString tex;
  undefined1 local_428 [1032];
  
  if (node != (DDLNode *)0x0) {
    local_428._0_8_ = local_428 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"attrib","");
    pPVar2 = ODDLParser::DDLNode::findPropertyByName(node,(string *)local_428);
    if ((undefined1 *)local_428._0_8_ != local_428 + 0x10) {
      operator_delete((void *)local_428._0_8_,local_428._16_8_ + 1);
    }
    if (((pPVar2 != (Property *)0x0) && (pPVar2->m_value != (Value *)0x0)) &&
       (this_00 = ODDLParser::DDLNode::getValue(node), this_00 != (Value *)0x0)) {
      local_428._0_8_ = local_428._0_8_ & 0xffffff0000000000;
      memset(local_428 + 5,0x1b,0x3ff);
      __s = ODDLParser::Value::getString(this_00);
      sVar3 = strlen(__s);
      iVar1 = (int)sVar3;
      if (iVar1 < 0x400) {
        local_428._0_4_ = iVar1;
        memcpy(local_428 + 4,__s,(long)iVar1);
        local_428[(long)iVar1 + 4] = 0;
      }
      ODDLParser::Value::getString(pPVar2->m_value);
      iVar1 = std::__cxx11::string::compare(Grammar::DiffuseTextureToken_abi_cxx11_);
      if (iVar1 == 0) {
        type = 1;
      }
      else {
        ODDLParser::Value::getString(pPVar2->m_value);
        iVar1 = std::__cxx11::string::compare(Grammar::SpecularPowerTextureToken_abi_cxx11_);
        if (iVar1 == 0) {
          type = 2;
        }
        else {
          ODDLParser::Value::getString(pPVar2->m_value);
          iVar1 = std::__cxx11::string::compare(Grammar::EmissionTextureToken_abi_cxx11_);
          if (iVar1 == 0) {
            type = 4;
          }
          else {
            ODDLParser::Value::getString(pPVar2->m_value);
            iVar1 = std::__cxx11::string::compare(Grammar::OpacyTextureToken_abi_cxx11_);
            if (iVar1 == 0) {
              type = 8;
            }
            else {
              ODDLParser::Value::getString(pPVar2->m_value);
              iVar1 = std::__cxx11::string::compare(Grammar::TransparencyTextureToken_abi_cxx11_);
              if (iVar1 == 0) {
                return;
              }
              ODDLParser::Value::getString(pPVar2->m_value);
              iVar1 = std::__cxx11::string::compare(Grammar::NormalTextureToken_abi_cxx11_);
              type = 6;
              if (iVar1 != 0) {
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                              ,0x447,
                              "void Assimp::OpenGEX::OpenGEXImporter::handleTextureNode(ODDLParser::DDLNode *, aiScene *)"
                             );
              }
            }
          }
        }
      }
      aiMaterial::AddProperty(this->m_currentMaterial,(aiString *)local_428,"$tex.file",type,0);
    }
  }
  return;
}

Assistant:

void OpenGEXImporter::handleTextureNode( ODDLParser::DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == node ) {
        return;
    }

    Property *prop = node->findPropertyByName( "attrib" );
    if( nullptr != prop ) {
        if( nullptr != prop->m_value ) {
            Value *val( node->getValue() );
            if( nullptr != val ) {
                aiString tex;
                tex.Set( val->getString() );
                if( prop->m_value->getString() == Grammar::DiffuseTextureToken ) {
                    m_currentMaterial->AddProperty( &tex, AI_MATKEY_TEXTURE_DIFFUSE( 0 ) );
                } else if( prop->m_value->getString() == Grammar::SpecularPowerTextureToken ) {
                    m_currentMaterial->AddProperty( &tex, AI_MATKEY_TEXTURE_SPECULAR( 0 ) );
                } else if( prop->m_value->getString() == Grammar::EmissionTextureToken ) {
                    m_currentMaterial->AddProperty( &tex, AI_MATKEY_TEXTURE_EMISSIVE( 0 ) );
                } else if( prop->m_value->getString() == Grammar::OpacyTextureToken ) {
                    m_currentMaterial->AddProperty( &tex, AI_MATKEY_TEXTURE_OPACITY( 0 ) );
                } else if( prop->m_value->getString() == Grammar::TransparencyTextureToken ) {
                    // ToDo!
                    // m_currentMaterial->AddProperty( &tex, AI_MATKEY_TEXTURE_DIFFUSE( 0 ) );
                } else if( prop->m_value->getString() == Grammar::NormalTextureToken ) {
                    m_currentMaterial->AddProperty( &tex, AI_MATKEY_TEXTURE_NORMALS( 0 ) );
                } else {
                    ai_assert( false );
                }
            }
        }
    }
}